

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjgc.cpp
# Opt level: O1

size_t __thiscall DSectorMarker::PropagateMark(DSectorMarker *this)

{
  uint32 *puVar1;
  uint uVar2;
  DSectorMarker *pDVar3;
  bool bVar4;
  sector_t_conflict *psVar5;
  side_t *psVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  
  if (sectors == (sector_t_conflict *)0x0) {
    bVar4 = false;
    iVar10 = 0;
  }
  else {
    iVar10 = *(int *)&(this->super_DObject).field_0x24;
    lVar8 = (long)iVar10;
    iVar7 = numsectors;
    if (numsectors < iVar10) {
      iVar7 = iVar10;
    }
    lVar12 = lVar8 * 0x218 + 0x170;
    uVar9 = 0;
    do {
      psVar5 = sectors;
      if (uVar9 == (uint)(iVar7 - iVar10)) break;
      pDVar3 = (DSectorMarker *)sectors[uVar9 + lVar8].SoundTarget.field_0.o;
      if (pDVar3 != (DSectorMarker *)0x0) {
        uVar2 = (pDVar3->super_DObject).ObjectFlags;
        if ((uVar2 & 0x20) == 0) {
          if ((uVar2 & 3) != 0) {
            (pDVar3->super_DObject).ObjectFlags = uVar2 & 0xffffffdc;
            (pDVar3->super_DObject).GCNext = &GC::Gray->super_DObject;
            GC::Gray = pDVar3;
          }
        }
        else {
          sectors[uVar9 + lVar8].SoundTarget.field_0.p = (AActor *)0x0;
        }
      }
      pDVar3 = (DSectorMarker *)psVar5[uVar9 + lVar8].SecActTarget.field_0.o;
      if (pDVar3 != (DSectorMarker *)0x0) {
        uVar2 = (pDVar3->super_DObject).ObjectFlags;
        if ((uVar2 & 0x20) == 0) {
          if ((uVar2 & 3) != 0) {
            (pDVar3->super_DObject).ObjectFlags = uVar2 & 0xffffffdc;
            (pDVar3->super_DObject).GCNext = &GC::Gray->super_DObject;
            GC::Gray = pDVar3;
          }
        }
        else {
          psVar5[uVar9 + lVar8].SecActTarget.field_0.p = (ASectorAction *)0x0;
        }
      }
      pDVar3 = (DSectorMarker *)psVar5[uVar9 + lVar8].floordata.field_0.o;
      if (pDVar3 != (DSectorMarker *)0x0) {
        uVar2 = (pDVar3->super_DObject).ObjectFlags;
        if ((uVar2 & 0x20) == 0) {
          if ((uVar2 & 3) != 0) {
            (pDVar3->super_DObject).ObjectFlags = uVar2 & 0xffffffdc;
            (pDVar3->super_DObject).GCNext = &GC::Gray->super_DObject;
            GC::Gray = pDVar3;
          }
        }
        else {
          psVar5[uVar9 + lVar8].floordata.field_0.p = (DSectorEffect *)0x0;
        }
      }
      pDVar3 = (DSectorMarker *)psVar5[uVar9 + lVar8].ceilingdata.field_0.o;
      if (pDVar3 != (DSectorMarker *)0x0) {
        uVar2 = (pDVar3->super_DObject).ObjectFlags;
        if ((uVar2 & 0x20) == 0) {
          if ((uVar2 & 3) != 0) {
            (pDVar3->super_DObject).ObjectFlags = uVar2 & 0xffffffdc;
            (pDVar3->super_DObject).GCNext = &GC::Gray->super_DObject;
            GC::Gray = pDVar3;
          }
        }
        else {
          psVar5[uVar9 + lVar8].ceilingdata.field_0.p = (DSectorEffect *)0x0;
        }
      }
      pDVar3 = (DSectorMarker *)psVar5[uVar9 + lVar8].lightingdata.field_0.o;
      if (pDVar3 != (DSectorMarker *)0x0) {
        uVar2 = (pDVar3->super_DObject).ObjectFlags;
        if ((uVar2 & 0x20) == 0) {
          if ((uVar2 & 3) != 0) {
            (pDVar3->super_DObject).ObjectFlags = uVar2 & 0xffffffdc;
            (pDVar3->super_DObject).GCNext = &GC::Gray->super_DObject;
            GC::Gray = pDVar3;
          }
        }
        else {
          psVar5[uVar9 + lVar8].lightingdata.field_0.p = (DSectorEffect *)0x0;
        }
      }
      lVar13 = 0;
      do {
        pDVar3 = *(DSectorMarker **)((long)&psVar5->planes[0].xform.xOffs + lVar13 * 8 + lVar12);
        if (pDVar3 != (DSectorMarker *)0x0) {
          uVar2 = (pDVar3->super_DObject).ObjectFlags;
          if ((uVar2 & 0x20) == 0) {
            if ((uVar2 & 3) != 0) {
              (pDVar3->super_DObject).ObjectFlags = uVar2 & 0xffffffdc;
              (pDVar3->super_DObject).GCNext = &GC::Gray->super_DObject;
              GC::Gray = pDVar3;
            }
          }
          else {
            *(undefined8 *)((long)&psVar5->planes[0].xform.xOffs + lVar13 * 8 + lVar12) = 0;
          }
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 4);
      uVar9 = uVar9 + 1;
      lVar12 = lVar12 + 0x218;
    } while (uVar9 != 0x20);
    iVar10 = (int)uVar9 * 0x218;
    iVar7 = (int)uVar9 + *(int *)&(this->super_DObject).field_0x24;
    if (iVar7 < numsectors) {
      *(int *)&(this->super_DObject).field_0x24 = iVar7;
      bVar4 = true;
    }
    else {
      bVar4 = false;
    }
  }
  if ((!bVar4) && (polyobjs != (FPolyObj *)0x0)) {
    iVar7 = this->PolyNum;
    iVar11 = po_NumPolyobjs;
    if (po_NumPolyobjs < iVar7) {
      iVar11 = iVar7;
    }
    lVar8 = (long)iVar7 * 0xf0;
    uVar9 = 0;
    do {
      if ((uint)(iVar11 - iVar7) == uVar9) break;
      pDVar3 = *(DSectorMarker **)((long)polyobjs->bbox + lVar8 + 0x3c);
      if (pDVar3 != (DSectorMarker *)0x0) {
        uVar2 = (pDVar3->super_DObject).ObjectFlags;
        if ((uVar2 & 0x20) == 0) {
          if ((uVar2 & 3) != 0) {
            (pDVar3->super_DObject).ObjectFlags = uVar2 & 0xffffffdc;
            (pDVar3->super_DObject).GCNext = &GC::Gray->super_DObject;
            GC::Gray = pDVar3;
          }
        }
        else {
          *(undefined8 *)((long)polyobjs->bbox + lVar8 + 0x3c) = 0;
        }
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0xf0;
    } while (uVar9 != 0x78);
    iVar10 = (int)uVar9 * 0xf0 + iVar10;
    iVar7 = (int)uVar9 + this->PolyNum;
    if (iVar7 < po_NumPolyobjs) {
      this->PolyNum = iVar7;
      bVar4 = true;
    }
  }
  if ((!bVar4) && (sides != (side_t *)0x0)) {
    iVar7 = this->SideNum;
    iVar11 = numsides;
    if (numsides < iVar7) {
      iVar11 = iVar7;
    }
    lVar8 = (long)iVar7 * 0xc0;
    uVar9 = 0;
    do {
      psVar6 = sides;
      if (uVar9 == (uint)(iVar11 - iVar7)) break;
      lVar12 = 0x38;
      do {
        pDVar3 = *(DSectorMarker **)((long)psVar6->textures + lVar12 + lVar8 + -0x10);
        if (pDVar3 != (DSectorMarker *)0x0) {
          uVar2 = (pDVar3->super_DObject).ObjectFlags;
          if ((uVar2 & 0x20) == 0) {
            if ((uVar2 & 3) != 0) {
              (pDVar3->super_DObject).ObjectFlags = uVar2 & 0xffffffdc;
              (pDVar3->super_DObject).GCNext = &GC::Gray->super_DObject;
              GC::Gray = pDVar3;
            }
          }
          else {
            *(undefined8 *)((long)psVar6->textures + lVar12 + lVar8 + -0x10) = 0;
          }
        }
        lVar12 = lVar12 + 0x30;
      } while (lVar12 != 200);
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0xc0;
    } while (uVar9 != 0xf0);
    iVar10 = (int)uVar9 * 0xc0 + iVar10;
    iVar7 = (int)uVar9 + this->SideNum;
    if (iVar7 < numsides) {
      this->SideNum = iVar7;
      bVar4 = true;
    }
  }
  if (bVar4) {
    puVar1 = &(this->super_DObject).ObjectFlags;
    *(byte *)puVar1 = (byte)*puVar1 & 0xfb;
    (this->super_DObject).GCNext = &GC::Gray->super_DObject;
    GC::Gray = this;
  }
  return (long)iVar10;
}

Assistant:

size_t DSectorMarker::PropagateMark()
{
	int i;
	int marked = 0;
	bool moretodo = false;

	if (sectors != NULL)
	{
		for (i = 0; i < SECTORSTEPSIZE && SecNum + i < numsectors; ++i)
		{
			sector_t *sec = &sectors[SecNum + i];
			GC::Mark(sec->SoundTarget);
			GC::Mark(sec->SecActTarget);
			GC::Mark(sec->floordata);
			GC::Mark(sec->ceilingdata);
			GC::Mark(sec->lightingdata);
			for(int j=0;j<4;j++) GC::Mark(sec->interpolations[j]);
		}
		marked += i * sizeof(sector_t);
		if (SecNum + i < numsectors)
		{
			SecNum += i;
			moretodo = true;
		}
	}
	if (!moretodo && polyobjs != NULL)
	{
		for (i = 0; i < POLYSTEPSIZE && PolyNum + i < po_NumPolyobjs; ++i)
		{
			GC::Mark(polyobjs[PolyNum + i].interpolation);
		}
		marked += i * sizeof(FPolyObj);
		if (PolyNum + i < po_NumPolyobjs)
		{
			PolyNum += i;
			moretodo = true;
		}
	}
	if (!moretodo && sides != NULL)
	{
		for (i = 0; i < SIDEDEFSTEPSIZE && SideNum + i < numsides; ++i)
		{
			side_t *side = &sides[SideNum + i];
			for(int j=0;j<3;j++) GC::Mark(side->textures[j].interpolation);
		}
		marked += i * sizeof(side_t);
		if (SideNum + i < numsides)
		{
			SideNum += i;
			moretodo = true;
		}
	}
	// If there are more sectors to mark, put ourself back into the gray
	// list.
	if (moretodo)
	{
		Black2Gray();
		GCNext = GC::Gray;
		GC::Gray = this;
	}
	return marked;
}